

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O1

void eAX_Iv(PDISASM pMyDisasm)

{
  OPTYPE *pBuffer;
  UInt8 UVar1;
  int iVar2;
  Int32 IVar3;
  char (*pacVar4) [8];
  char (*pacVar5) [4];
  char (*__src) [8];
  ulong uVar6;
  long lVar7;
  
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  pBuffer = &pMyDisasm->Operand2;
  (pMyDisasm->Operand2).OpType = 0x8040000;
  iVar2 = (pMyDisasm->Reserved_).OperandSize;
  uVar6 = (pMyDisasm->Reserved_).EndOfBlock;
  if (iVar2 == 0x20) {
    if ((uVar6 == 0) || ((pMyDisasm->Reserved_).EIP_ + 5 <= uVar6)) {
      (pMyDisasm->Reserved_).ImmediatSize = 0x20;
      (pMyDisasm->Operand1).OpSize = 0x20;
      (pMyDisasm->Operand2).OpSize = 0x20;
      uVar6 = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
      CopyFormattedNumber(pMyDisasm,pBuffer->OpMnemonic,"%.8X",uVar6);
      (pMyDisasm->Instruction).Immediat = uVar6;
      UVar1 = (pMyDisasm->Reserved_).REX.B_;
      pacVar4 = Registers32Bits + 8;
      pacVar5 = (char (*) [4])Registers32Bits;
LAB_0013ea14:
      __src = (char (*) [8])pacVar5;
      if (UVar1 == '\x01') {
        __src = pacVar4;
      }
      lVar7 = 5;
LAB_0013eaa4:
      strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + lVar7;
      IVar3 = 2;
      if ((pMyDisasm->Prefix).LockPrefix != '\x01') {
        return;
      }
      goto LAB_0013eac5;
    }
  }
  else if (iVar2 == 0x40) {
    if ((uVar6 == 0) || ((pMyDisasm->Reserved_).EIP_ + 5 <= uVar6)) {
      (pMyDisasm->Reserved_).ImmediatSize = 0x20;
      (pMyDisasm->Operand1).OpSize = 0x40;
      (pMyDisasm->Operand2).OpSize = 0x20;
      uVar6 = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
      CopyFormattedNumber(pMyDisasm,pBuffer->OpMnemonic,"%.16llX",uVar6);
      (pMyDisasm->Instruction).Immediat = uVar6;
      UVar1 = (pMyDisasm->Reserved_).REX.B_;
      pacVar4 = (char (*) [8])(Registers64Bits + 8);
      pacVar5 = Registers64Bits;
      goto LAB_0013ea14;
    }
  }
  else if ((uVar6 == 0) || ((pMyDisasm->Reserved_).EIP_ + 3 <= uVar6)) {
    (pMyDisasm->Reserved_).ImmediatSize = 0x10;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand2).OpSize = 0x10;
    uVar6 = (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,pBuffer->OpMnemonic,"%.8X",uVar6);
    (pMyDisasm->Instruction).Immediat = uVar6;
    __src = Registers16Bits;
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      __src = Registers16Bits + 8;
    }
    lVar7 = 3;
    goto LAB_0013eaa4;
  }
  (pMyDisasm->Reserved_).OutOfBlock = 1;
  IVar3 = -2;
LAB_0013eac5:
  (pMyDisasm->Reserved_).ERROR_OPCODE = IVar3;
  return;
}

Assistant:

void __bea_callspec__ eAX_Iv(PDISASM pMyDisasm)
{
    UInt32 MyNumber;
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
    pMyDisasm->Operand1.Registers.gpr = REG0;
    pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
    if (GV.OperandSize == 64) {
      if (!Security(5, pMyDisasm)) return;
      GV.ImmediatSize = 32;
      pMyDisasm->Operand1.OpSize = 64;
      pMyDisasm->Operand2.OpSize = 32;
      MyNumber = *((UInt32*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.16llX",(Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0+8]);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
          #endif
      }
      GV.EIP_+= 5;
    }
    else if (GV.OperandSize == 32) {
      if (!Security(5, pMyDisasm)) return;
      GV.ImmediatSize = 32;
      pMyDisasm->Operand1.OpSize = 32;
      pMyDisasm->Operand2.OpSize = 32;
      MyNumber = *((UInt32*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X",(Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0+8]);
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
        #endif
      }
      GV.EIP_+= 5;
    }
    else {
      if (!Security(3, pMyDisasm)) return;
      GV.ImmediatSize = 16;
      pMyDisasm->Operand1.OpSize = 16;
      pMyDisasm->Operand2.OpSize = 16;
      MyNumber = *((UInt16*) (GV.EIP_+1));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.8X", (Int64) MyNumber);
      #endif
      pMyDisasm->Instruction.Immediat = MyNumber;
       if (GV.REX.B_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0+8]);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
          #endif
      }
      GV.EIP_+= 3;
    }
    if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
      GV.ERROR_OPCODE = UD_;
    }
}